

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_SimdBool32x4<Js::OpLayoutT_Bool32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Bool32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  long lVar1;
  long lVar2;
  SIMDValue SVar3;
  
  lVar1 = *(long *)(this + 0x118);
  SVar3 = SIMDBool32x4Operation::OpBool32x4
                    (*(int *)(lVar1 + (ulong)playout->I1 * 4) != 0,
                     *(int *)(lVar1 + (ulong)playout->I2 * 4) != 0,
                     *(int *)(lVar1 + (ulong)playout->I3 * 4) != 0,
                     *(int *)(lVar1 + (ulong)playout->I4 * 4) != 0);
  lVar1 = *(long *)(this + 0x148);
  lVar2 = (ulong)playout->B4_0 * 0x10;
  *(long *)(lVar1 + lVar2) = SVar3.field_0._0_8_;
  *(long *)(lVar1 + 8 + lVar2) = SVar3.field_0._8_8_;
  return;
}

Assistant:

void InterpreterStackFrame::OP_SimdBool32x4(const unaligned T* playout)
    {
        bool arg1 = GetRegRawInt(playout->I1) ? true : false;
        bool arg2 = GetRegRawInt(playout->I2) ? true : false;
        bool arg3 = GetRegRawInt(playout->I3) ? true : false;
        bool arg4 = GetRegRawInt(playout->I4) ? true : false;
        AsmJsSIMDValue result = SIMDBool32x4Operation::OpBool32x4(arg1, arg2, arg3, arg4);
        SetRegRawSimd(playout->B4_0, result);

    }